

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
::FindEntryWithKey<Js::HashedCharacterBuffer<char16_t>*>
          (BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
           *this,HashedCharacterBuffer<char16_t> **key)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  uint uVar4;
  hash_t extraout_EDX;
  hash_t otherHashCode;
  hash_t extraout_EDX_00;
  DictionaryStats *this_00;
  int iVar5;
  DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *pDVar6;
  
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    uVar4 = 0;
  }
  else {
    uVar4 = BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         *)this,*(int *)&((*key)->super_CharacterBuffer<char16_t>).field_0xc * 2 + 1
                       );
    lVar2 = *(long *)(this + 8);
    pDVar6 = (DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::KeyValueEntry>
              *)(lVar1 + (ulong)uVar4 * 4);
    uVar4 = 0;
    otherHashCode = extraout_EDX;
    while( true ) {
      iVar5 = *(int *)pDVar6;
      if ((long)iVar5 < 0) break;
      pDVar6 = (DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                *)((long)iVar5 * 0x18 + lVar2);
      bVar3 = DefaultHashedEntry<Memory::WriteBarrierPtr<Js::HashedCharacterBuffer<char16_t>>,Memory::WriteBarrierPtr<Js::PropertyRecord_const>,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::
              KeyEquals<Js::PropertyRecordStringHashComparer<Js::HashedCharacterBuffer<char16_t>*>,Js::HashedCharacterBuffer<char16_t>*>
                        (pDVar6,key,otherHashCode);
      if (bVar3) {
        this_00 = *(DictionaryStats **)(this + 0x30);
        goto LAB_00726f15;
      }
      uVar4 = uVar4 + 1;
      pDVar6 = pDVar6 + 8;
      otherHashCode = extraout_EDX_00;
    }
  }
  this_00 = *(DictionaryStats **)(this + 0x30);
  iVar5 = -1;
LAB_00726f15:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  return iVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }